

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::
CreateTestGLTexture<Diligent::RenderDeviceGLImpl::TestTextureFormat(Diligent::TEXTURE_FORMAT)::__7>
          (Diligent *this,GLContextState *GlCtxState,GLenum BindTarget,GLTextureObj *GLTexObj,
          anon_class_16_2_62d66f4c CreateFunc)

{
  GLenum BindTarget_00;
  GLContextState *this_00;
  int iVar1;
  undefined4 in_register_00000014;
  GLTextureCreateReleaseHelper local_44;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_40;
  byte local_31;
  GLTextureObj *pGStack_30;
  bool bSuccess;
  GLTextureObj *GLTexObj_local;
  GLContextState *pGStack_20;
  GLenum BindTarget_local;
  GLContextState *GlCtxState_local;
  anon_class_16_2_62d66f4c CreateFunc_local;
  
  pGStack_30 = (GLTextureObj *)CONCAT44(in_register_00000014,BindTarget);
  CreateFunc_local.SampleCount = CreateFunc.SampleCount;
  GLTexObj_local._4_4_ = (GLenum)GlCtxState;
  pGStack_20 = (GLContextState *)this;
  GlCtxState_local = (GLContextState *)GLTexObj;
  GLContextState::BindTexture((GLContextState *)this,-1,GLTexObj_local._4_4_,pGStack_30);
  RenderDeviceGLImpl::TestTextureFormat::anon_class_16_2_62d66f4c::operator()
            ((anon_class_16_2_62d66f4c *)&GlCtxState_local);
  iVar1 = glGetError();
  this_00 = pGStack_20;
  BindTarget_00 = GLTexObj_local._4_4_;
  local_31 = iVar1 == 0;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_44,0);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&local_40,false,local_44);
  GLContextState::BindTexture(this_00,-1,BindTarget_00,&local_40);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&local_40);
  return (bool)(local_31 & 1);
}

Assistant:

bool CreateTestGLTexture(GLContextState& GlCtxState, GLenum BindTarget, const GLObjectWrappers::GLTextureObj& GLTexObj, CreateFuncType CreateFunc)
{
    GlCtxState.BindTexture(-1, BindTarget, GLTexObj);
    CreateFunc();
    bool bSuccess = glGetError() == GL_NO_ERROR;
    GlCtxState.BindTexture(-1, BindTarget, GLObjectWrappers::GLTextureObj{false});
    return bSuccess;
}